

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O0

void fl_init_workarea(void)

{
  int iVar1;
  undefined8 *local_40;
  long *xywh;
  undefined1 local_30 [4];
  int format;
  unsigned_long remaining;
  unsigned_long count;
  Atom actual;
  
  fl_open_display();
  local_40 = (undefined8 *)0x0;
  iVar1 = Fl::screen_count();
  if (iVar1 < 2) {
    iVar1 = XGetWindowProperty(fl_display,
                               *(undefined8 *)
                                (*(long *)(fl_display + 0xe8) + (long)fl_screen * 0x80 + 0x10),
                               fl_NET_WORKAREA,0,4,0,6,&count,(long)&xywh + 4,&remaining,local_30,
                               &local_40);
    if ((((iVar1 == 0) && (local_40 != (undefined8 *)0x0)) && (local_40[2] != 0)) &&
       (local_40[3] != 0)) {
      fl_workarea_xywh[0] = (int)*local_40;
      fl_workarea_xywh[1] = (int)local_40[1];
      fl_workarea_xywh[2] = (int)local_40[2];
      fl_workarea_xywh[3] = (int)local_40[3];
      goto LAB_001d72ca;
    }
  }
  Fl::screen_xywh(fl_workarea_xywh,fl_workarea_xywh + 1,fl_workarea_xywh + 2,fl_workarea_xywh + 3,0)
  ;
LAB_001d72ca:
  if (local_40 != (undefined8 *)0x0) {
    XFree(local_40);
  }
  return;
}

Assistant:

static void fl_init_workarea() {
  fl_open_display();

  Atom actual;
  unsigned long count, remaining;
  int format;
  long *xywh = 0;

  /* If there are several screens, the _NET_WORKAREA property 
   does not give the work area of the main screen, but that of all screens together.
   Therefore, we use this property only when there is a single screen,
   and fall back to the main screen full area when there are several screens.
   */
  if (Fl::screen_count() > 1 || XGetWindowProperty(fl_display, RootWindow(fl_display, fl_screen),
			 fl_NET_WORKAREA, 0, 4, False,
                         XA_CARDINAL, &actual, &format, &count, &remaining,
                         (unsigned char **)&xywh) || !xywh || !xywh[2] ||
                         !xywh[3])
  {
    Fl::screen_xywh(fl_workarea_xywh[0], 
		    fl_workarea_xywh[1], 
		    fl_workarea_xywh[2], 
		    fl_workarea_xywh[3], 0);
  }
  else
  {
    fl_workarea_xywh[0] = (int)xywh[0];
    fl_workarea_xywh[1] = (int)xywh[1];
    fl_workarea_xywh[2] = (int)xywh[2];
    fl_workarea_xywh[3] = (int)xywh[3];
  }
  if ( xywh ) { XFree(xywh); xywh = 0; }
}